

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_console.hpp
# Opt level: O2

bool iutest::detail::iuConsole::IsShouldUseColor(bool use_color)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  
  bVar3 = 1;
  bVar1 = IsColorModeOn();
  if (!bVar1) {
    bVar1 = IsColorModeOff();
    if (bVar1) {
      bVar3 = 0;
    }
    else {
      if (IsShouldUseColor(bool)::has_color == '\0') {
        iVar2 = __cxa_guard_acquire(&IsShouldUseColor(bool)::has_color);
        if (iVar2 != 0) {
          IsShouldUseColor::has_color = HasColorConsole();
          __cxa_guard_release(&IsShouldUseColor(bool)::has_color);
        }
      }
      bVar3 = use_color & IsShouldUseColor::has_color;
    }
  }
  return (bool)bVar3;
}

Assistant:

inline bool iuConsole::IsShouldUseColor(bool use_color)
{
    if( IsColorModeOn() )
    {
        return true;
    }
    else if( IsColorModeOff() )
    {
        return false;
    }
    static bool has_color = HasColorConsole();
    return use_color && has_color;
}